

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_sint.hpp
# Opt level: O2

size_t ans_sint_compress<5u>(uint8_t *dst,size_t dstCapacity,uint32_t *src,size_t srcSize)

{
  uint64_t uVar1;
  long lVar2;
  uint8_t *puVar3;
  ulong uVar4;
  array<unsigned_long,_4UL> states;
  ans_sint_encode<5U> ans_frame;
  uint8_t *local_a0;
  uint8_t *local_98;
  uint64_t local_90 [4];
  ans_sint_encode<5U> local_70;
  
  ans_sint_encode<5U>::create(&local_70,src,srcSize);
  local_a0 = dst;
  ans_sint_encode<5U>::serialize(&local_70,&local_a0);
  uVar1 = local_70.lower_bound;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    local_90[lVar2] = uVar1;
  }
  local_98 = dst;
  for (lVar2 = 0; -lVar2 != (ulong)((uint)srcSize & 3); lVar2 = lVar2 + -1) {
    ans_sint_encode<5U>::encode_symbol(&local_70,local_90,src[srcSize + lVar2 + -1],&local_a0);
  }
  for (uVar4 = srcSize & 0xfffffffffffffffc; uVar4 != 0; uVar4 = uVar4 - 4) {
    ans_sint_encode<5U>::encode_symbol(&local_70,local_90,src[uVar4 - 1],&local_a0);
    ans_sint_encode<5U>::encode_symbol(&local_70,local_90 + 1,src[uVar4 - 2],&local_a0);
    ans_sint_encode<5U>::encode_symbol(&local_70,local_90 + 2,src[uVar4 - 3],&local_a0);
    ans_sint_encode<5U>::encode_symbol(&local_70,local_90 + 3,src[uVar4 - 4],&local_a0);
  }
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 8) {
    *(uint64_t *)(local_a0 + lVar2) = *(long *)((long)local_90 + lVar2) - local_70.lower_bound;
  }
  puVar3 = local_a0 + (0x20 - (long)local_98);
  ans_sint_encode<5U>::~ans_sint_encode(&local_70);
  return (size_t)puVar3;
}

Assistant:

size_t ans_sint_compress(
    uint8_t* dst, size_t dstCapacity, const uint32_t* src, size_t srcSize)
{
    const uint32_t num_states = 4;
#ifdef RECORD_STATS
    auto start_compress = std::chrono::high_resolution_clock::now();
#endif

    auto in_u32 = reinterpret_cast<const uint32_t*>(src);
    auto ans_frame = ans_sint_encode<H_approx>::create(in_u32, srcSize);
    uint8_t* out_u8 = reinterpret_cast<uint8_t*>(dst);

    // serialize model
    ans_frame.serialize(out_u8);

    std::array<uint64_t, num_states> states;

    // start encoding
    for (uint32_t i = 0; i < num_states; i++)
        states[i] = ans_frame.initial_state();

#ifdef RECORD_STATS
    auto stop_prelude = std::chrono::high_resolution_clock::now();
    get_stats().prelude_bytes = out_u8 - reinterpret_cast<uint8_t*>(dst);
    get_stats().prelude_time_ns = (stop_prelude - start_compress).count();
#endif

    // std::cout << "encoding" << std::endl;
    size_t cur_sym = 0;
    while ((srcSize - cur_sym) % num_states != 0) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        cur_sym += 1;
    }
    while (cur_sym != srcSize) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        ans_frame.encode_symbol(
            states[1], in_u32[srcSize - cur_sym - 2], out_u8);
        ans_frame.encode_symbol(
            states[2], in_u32[srcSize - cur_sym - 3], out_u8);
        ans_frame.encode_symbol(
            states[3], in_u32[srcSize - cur_sym - 4], out_u8);
        cur_sym += num_states;
    }

    // flush final state
    for (uint32_t i = 0; i < num_states; i++)
        ans_frame.flush_state(states[i], out_u8);

#ifdef RECORD_STATS
    auto stop_compress = std::chrono::high_resolution_clock::now();
    get_stats().encode_bytes = (out_u8 - reinterpret_cast<uint8_t*>(dst))
        - get_stats().prelude_bytes;
    get_stats().encode_time_ns = (stop_compress - stop_prelude).count();
#endif

    return out_u8 - reinterpret_cast<uint8_t*>(dst);
}